

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcacheoptimizer.cpp
# Opt level: O1

void meshopt::buildTriangleAdjacency
               (TriangleAdjacency *adjacency,uint *indices,size_t index_count,size_t vertex_count,
               meshopt_Allocator *allocator)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  size_t sVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint *puVar9;
  
  uVar8 = -(ulong)(vertex_count >> 0x3e != 0) | vertex_count * 4;
  puVar4 = (uint *)(*meshopt_Allocator::StorageT<void>::allocate)(uVar8);
  sVar5 = allocator->count;
  allocator->count = sVar5 + 1;
  allocator->blocks[sVar5] = puVar4;
  adjacency->counts = puVar4;
  puVar4 = (uint *)(*meshopt_Allocator::StorageT<void>::allocate)(uVar8);
  sVar5 = allocator->count;
  allocator->count = sVar5 + 1;
  allocator->blocks[sVar5] = puVar4;
  adjacency->offsets = puVar4;
  puVar4 = (uint *)(*meshopt_Allocator::StorageT<void>::allocate)
                             (-(ulong)(index_count >> 0x3e != 0) | index_count * 4);
  sVar5 = allocator->count;
  allocator->count = sVar5 + 1;
  allocator->blocks[sVar5] = puVar4;
  adjacency->data = puVar4;
  memset(adjacency->counts,0,vertex_count * 4);
  if (index_count != 0) {
    puVar4 = adjacency->counts;
    sVar5 = 0;
    do {
      puVar4[indices[sVar5]] = puVar4[indices[sVar5]] + 1;
      sVar5 = sVar5 + 1;
    } while (index_count != sVar5);
  }
  if (vertex_count != 0) {
    puVar4 = adjacency->counts;
    puVar3 = adjacency->offsets;
    uVar6 = 0;
    sVar5 = 0;
    do {
      puVar3[sVar5] = uVar6;
      uVar6 = uVar6 + puVar4[sVar5];
      sVar5 = sVar5 + 1;
    } while (vertex_count != sVar5);
  }
  if (2 < index_count) {
    puVar4 = adjacency->offsets;
    puVar3 = adjacency->data;
    puVar9 = indices + 2;
    uVar8 = 0;
    do {
      uVar6 = puVar9[-1];
      uVar1 = *puVar9;
      uVar2 = puVar4[puVar9[-2]];
      puVar4[puVar9[-2]] = uVar2 + 1;
      uVar7 = (uint)uVar8;
      puVar3[uVar2] = uVar7;
      uVar2 = puVar4[uVar6];
      puVar4[uVar6] = uVar2 + 1;
      puVar3[uVar2] = uVar7;
      uVar6 = puVar4[uVar1];
      puVar4[uVar1] = uVar6 + 1;
      puVar3[uVar6] = uVar7;
      uVar8 = uVar8 + 1;
      puVar9 = puVar9 + 3;
    } while (index_count / 3 != uVar8);
  }
  if (vertex_count != 0) {
    puVar4 = adjacency->counts;
    puVar3 = adjacency->offsets;
    sVar5 = 0;
    do {
      puVar3[sVar5] = puVar3[sVar5] - puVar4[sVar5];
      sVar5 = sVar5 + 1;
    } while (vertex_count != sVar5);
  }
  return;
}

Assistant:

static void buildTriangleAdjacency(TriangleAdjacency& adjacency, const unsigned int* indices, size_t index_count, size_t vertex_count, meshopt_Allocator& allocator)
{
	size_t face_count = index_count / 3;

	// allocate arrays
	adjacency.counts = allocator.allocate<unsigned int>(vertex_count);
	adjacency.offsets = allocator.allocate<unsigned int>(vertex_count);
	adjacency.data = allocator.allocate<unsigned int>(index_count);

	// fill triangle counts
	memset(adjacency.counts, 0, vertex_count * sizeof(unsigned int));

	for (size_t i = 0; i < index_count; ++i)
	{
		assert(indices[i] < vertex_count);

		adjacency.counts[indices[i]]++;
	}

	// fill offset table
	unsigned int offset = 0;

	for (size_t i = 0; i < vertex_count; ++i)
	{
		adjacency.offsets[i] = offset;
		offset += adjacency.counts[i];
	}

	assert(offset == index_count);

	// fill triangle data
	for (size_t i = 0; i < face_count; ++i)
	{
		unsigned int a = indices[i * 3 + 0], b = indices[i * 3 + 1], c = indices[i * 3 + 2];

		adjacency.data[adjacency.offsets[a]++] = unsigned(i);
		adjacency.data[adjacency.offsets[b]++] = unsigned(i);
		adjacency.data[adjacency.offsets[c]++] = unsigned(i);
	}

	// fix offsets that have been disturbed by the previous pass
	for (size_t i = 0; i < vertex_count; ++i)
	{
		assert(adjacency.offsets[i] >= adjacency.counts[i]);

		adjacency.offsets[i] -= adjacency.counts[i];
	}
}